

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recv.c
# Opt level: O3

yrmcds_error yrmcds_recv(yrmcds *c,yrmcds_response *r)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  yrmcds_error yVar6;
  uint64_t n_3;
  void *pvVar7;
  char *pcVar8;
  ssize_t sVar9;
  int *piVar10;
  uint64_t uVar11;
  long lVar12;
  char *pcVar13;
  ulong *puVar14;
  uint uVar15;
  uint32_t uVar16;
  ulong uVar17;
  char cVar18;
  ulong uVar19;
  uint64_t n_1;
  char *pcVar20;
  long *plVar21;
  uint32_t n;
  uint uVar22;
  size_t sVar23;
  size_t sVar24;
  long *plVar25;
  ulong uVar26;
  
  if (r == (yrmcds_response *)0x0 || c == (yrmcds *)0x0) {
    return YRMCDS_BAD_ARGUMENT;
  }
  if (c->invalid != 0) {
    return YRMCDS_PROTOCOL_ERROR;
  }
  sVar24 = c->last_size;
  if (sVar24 != 0) {
    sVar23 = c->used - sVar24;
    if (sVar23 != 0) {
      memmove(c->recvbuf,c->recvbuf + sVar24,sVar23);
    }
    c->used = sVar23;
    c->last_size = 0;
    free(c->decompressed);
    c->decompressed = (char *)0x0;
  }
  if (c->text_mode != 0) {
    sVar24 = c->used;
    do {
      if (sVar24 != 0) {
        pcVar8 = c->recvbuf;
        pvVar7 = memchr(pcVar8,10,sVar24);
        if (pvVar7 != (void *)0x0) {
          if (((long)pvVar7 - (long)pcVar8 < 2) || (*(char *)((long)pvVar7 + -1) != '\r'))
          goto LAB_00124d9c;
          pcVar20 = (char *)((long)pvVar7 + -1);
          uVar19 = (long)pcVar20 - (long)pcVar8;
          r->data_len = 0;
          r->value = 0;
          r->key_len = 0;
          r->data = (char *)0x0;
          *(undefined8 *)&r->flags = 0;
          r->key = (char *)0x0;
          r->status = YRMCDS_STATUS_OK;
          r->command = YRMCDS_CMD_GET;
          r->cas_unique = 0;
          *(undefined8 *)r = 0;
          r->length = 0;
          uVar16 = c->rserial + 1;
          c->rserial = uVar16;
          r->serial = uVar16;
          sVar24 = uVar19 + 2;
          r->length = sVar24;
          r->command = YRMCDS_CMD_BOTTOM;
          switch(uVar19) {
          case 2:
            if (*(short *)c->recvbuf == 0x4b4f) {
              uVar26 = 4;
              goto LAB_00124e07;
            }
            break;
          case 3:
            if ((char)*(short *)((long)c->recvbuf + 2) == 'D' && *(short *)c->recvbuf == 0x4e45) {
              r->status = YRMCDS_STATUS_NOTFOUND;
              uVar26 = 5;
              goto LAB_00124e07;
            }
            break;
          case 5:
            if ((char)*(int *)((long)c->recvbuf + 4) == 'R' && *(int *)c->recvbuf == 0x4f525245) {
              r->status = YRMCDS_STATUS_UNKNOWNCOMMAND;
              uVar26 = 7;
              goto LAB_00124e07;
            }
            break;
          case 6:
            piVar10 = (int *)c->recvbuf;
            uVar26 = 8;
            if ((short)piVar10[1] == 0x4445 && *piVar10 == 0x524f5453) goto LAB_00124e07;
            if ((short)piVar10[1] == 0x5354 && *piVar10 == 0x53495845) {
              r->status = YRMCDS_STATUS_EXISTS;
              goto LAB_00124e07;
            }
            break;
          case 7:
            piVar10 = (int *)c->recvbuf;
            uVar26 = 9;
            if ((*(int *)((long)piVar10 + 3) == 0x44455445 && *piVar10 == 0x454c4544) ||
               (*(int *)((long)piVar10 + 3) == 0x44454843 && *piVar10 == 0x43554f54))
            goto LAB_00124e07;
            break;
          case 9:
            if ((char)*(long *)((long)c->recvbuf + 8) == 'D' &&
                *(long *)c->recvbuf == 0x4e554f465f544f4e) {
              r->status = YRMCDS_STATUS_NOTFOUND;
              uVar26 = 0xb;
              goto LAB_00124e07;
            }
            break;
          case 10:
            if ((short)*(long *)((long)c->recvbuf + 8) == 0x4445 &&
                *(long *)c->recvbuf == 0x524f54535f544f4e) {
              r->status = YRMCDS_STATUS_NOTSTORED;
              uVar26 = 0xc;
              goto LAB_00124e07;
            }
          }
          uVar26 = sVar24;
          if (pcVar20 != pcVar8) {
            pcVar8 = c->recvbuf;
            cVar18 = *pcVar8;
            if ((byte)(cVar18 - 0x30U) < 10) {
              uVar11 = 0;
              do {
                pcVar8 = pcVar8 + 1;
                uVar11 = (ulong)(byte)(cVar18 - 0x30) + uVar11 * 10;
                cVar18 = *pcVar8;
              } while ((byte)(cVar18 - 0x30U) < 10);
              r->value = uVar11;
              goto LAB_00124e07;
            }
          }
          if (uVar19 < 9) {
            plVar21 = (long *)c->recvbuf;
            if (uVar19 < 7) goto LAB_00124dc7;
          }
          else {
            plVar21 = (long *)c->recvbuf;
            if (*plVar21 == 0x204e4f4953524556) {
              r->data_len = uVar19 - 8;
              r->data = (char *)(plVar21 + 1);
              goto LAB_00124e07;
            }
          }
          if (*(short *)((long)plVar21 + 4) == 0x2045 && (int)*plVar21 == 0x554c4156) {
            pcVar8 = (char *)((long)plVar21 + 5);
            plVar25 = plVar21;
            do {
              plVar25 = (long *)((long)plVar25 + 1);
              pcVar13 = pcVar8 + 1;
              pcVar8 = pcVar8 + 1;
            } while (*pcVar13 == ' ');
            if ((pcVar8 != pcVar20) &&
               (pvVar7 = memchr(pcVar8,0x20,(long)pvVar7 + (-6 - (long)plVar25)),
               pvVar7 != (void *)0x0)) {
              r->key = pcVar8;
              r->key_len = (long)pvVar7 + (-5 - (long)plVar25);
              lVar12 = (long)pvVar7 + -2;
              do {
                cVar18 = *(char *)(lVar12 + 2);
                lVar12 = lVar12 + 1;
              } while (cVar18 == ' ');
              if ((byte)(cVar18 - 0x30U) < 10) {
                uVar16 = 0;
                do {
                  uVar16 = (uint)(byte)(cVar18 - 0x30) + uVar16 * 10;
                  cVar18 = *(char *)(lVar12 + 2);
                  lVar12 = lVar12 + 1;
                } while ((byte)(cVar18 - 0x30U) < 10);
                if (cVar18 == ' ') {
                  r->flags = uVar16;
                  do {
                    cVar18 = *(char *)(lVar12 + 1);
                    lVar12 = lVar12 + 1;
                  } while (cVar18 == ' ');
                  uVar17 = 0;
                  if ((byte)(cVar18 - 0x30U) < 10) {
                    do {
                      uVar17 = (ulong)(byte)(cVar18 - 0x30) + uVar17 * 10;
                      cVar18 = *(char *)(lVar12 + 1);
                      lVar12 = lVar12 + 1;
                    } while ((byte)(cVar18 - 0x30U) < 10);
                    if (0x3200000 < uVar17) goto LAB_00124d9c;
                  }
                  pcVar8 = (char *)(lVar12 + -1);
                  do {
                    pcVar20 = pcVar8 + 1;
                    pcVar8 = pcVar8 + 1;
                  } while (*pcVar20 == ' ');
                  if (0xf5 < (byte)(*pcVar20 - 0x3aU)) {
                    do {
                      cVar18 = *pcVar8;
                      pcVar8 = pcVar8 + 1;
                    } while (cVar18 == ' ');
                    uVar11 = 0;
                    while ((byte)(cVar18 - 0x30U) < 10) {
                      uVar11 = (ulong)(byte)(cVar18 - 0x30) + uVar11 * 10;
                      cVar18 = *pcVar8;
                      pcVar8 = pcVar8 + 1;
                    }
                    uVar26 = uVar19 + uVar17 + 9;
                    while (c->used < uVar26) {
                      yVar6 = recv_data(c);
                      if (yVar6 != YRMCDS_OK) {
                        return yVar6;
                      }
                    }
                    pcVar8 = c->recvbuf + sVar24;
                    if (*(int *)(pcVar8 + uVar17 + 3) == 0xa0d444e &&
                        *(int *)(pcVar8 + uVar17) == 0x4e450a0d) {
                      r->length = uVar26;
                      r->flags = uVar16;
                      r->data = pcVar8;
                      r->data_len = uVar17;
                      r->cas_unique = uVar11;
                      goto LAB_00124e07;
                    }
                    goto LAB_00124d9c;
                  }
                }
              }
            }
          }
LAB_00124dc7:
          r->status = YRMCDS_STATUS_OTHER;
          fprintf(_stderr,"[libyrmcds] unknown response: %.*s\n",uVar19 & 0xffffffff,plVar21);
          uVar26 = r->length;
LAB_00124e07:
          c->last_size = uVar26;
          return YRMCDS_OK;
        }
      }
      if (c->capacity - sVar24 < 0x40000) {
        sVar23 = c->capacity * 2;
        pcVar8 = (char *)realloc(c->recvbuf,sVar23);
        if (pcVar8 == (char *)0x0) {
          return YRMCDS_OUT_OF_MEMORY;
        }
        c->recvbuf = pcVar8;
        c->capacity = sVar23;
      }
      while (sVar9 = recv(c->sock,c->recvbuf + c->used,0x40000,0), sVar9 == -1) {
        piVar10 = __errno_location();
        if (*piVar10 != 4) {
          return YRMCDS_SYSTEM_ERROR;
        }
      }
      if (sVar9 == 0) {
        return YRMCDS_DISCONNECTED;
      }
      sVar24 = sVar9 + c->used;
      c->used = sVar24;
    } while( true );
  }
  uVar19 = c->used;
  while (uVar19 < 0x18) {
    if (c->capacity - uVar19 < 0x40000) {
      sVar23 = c->capacity * 2;
      pcVar8 = (char *)realloc(c->recvbuf,sVar23);
      if (pcVar8 == (char *)0x0) {
        return YRMCDS_OUT_OF_MEMORY;
      }
      c->recvbuf = pcVar8;
      c->capacity = sVar23;
    }
    while (sVar9 = recv(c->sock,c->recvbuf + c->used,0x40000,0), sVar9 == -1) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        return YRMCDS_SYSTEM_ERROR;
      }
    }
    if (sVar9 == 0) {
      return YRMCDS_DISCONNECTED;
    }
    uVar19 = sVar9 + c->used;
    c->used = uVar19;
  }
  pcVar8 = c->recvbuf;
  if (*pcVar8 == -0x7f) {
    uVar22 = *(uint *)(pcVar8 + 8);
    uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
    if (uVar22 < 0x3200001) {
      uVar26 = (ulong)(uVar22 + 0x18);
      if (uVar19 < uVar26) {
        do {
          if (c->capacity - uVar19 < 0x40000) {
            sVar23 = c->capacity * 2;
            pcVar8 = (char *)realloc(c->recvbuf,sVar23);
            if (pcVar8 == (char *)0x0) {
              return YRMCDS_OUT_OF_MEMORY;
            }
            c->recvbuf = pcVar8;
            c->capacity = sVar23;
          }
          while (sVar9 = recv(c->sock,c->recvbuf + c->used,0x40000,0), sVar9 == -1) {
            piVar10 = __errno_location();
            if (*piVar10 != 4) {
              return YRMCDS_SYSTEM_ERROR;
            }
          }
          if (sVar9 == 0) {
            return YRMCDS_DISCONNECTED;
          }
          uVar19 = sVar9 + c->used;
          c->used = uVar19;
        } while (uVar19 < uVar26);
        pcVar8 = c->recvbuf;
      }
      uVar3 = *(ushort *)(pcVar8 + 2);
      uVar5 = uVar3 << 8 | uVar3 >> 8;
      bVar1 = pcVar8[4];
      uVar15 = (uint)uVar5 + (uint)bVar1;
      if (uVar15 <= uVar22) {
        pcVar13 = pcVar8 + (ulong)bVar1 + 0x18;
        r->length = uVar26;
        bVar2 = pcVar8[1];
        r->command = (uint)bVar2;
        pcVar20 = (char *)0x0;
        if (uVar3 != 0) {
          pcVar20 = pcVar13;
        }
        r->key = pcVar20;
        r->key_len = (ulong)uVar5;
        uVar3 = *(ushort *)(pcVar8 + 6);
        r->status = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        r->serial = *(uint32_t *)(pcVar8 + 0xc);
        pcVar8 = c->recvbuf;
        uVar19 = *(ulong *)(pcVar8 + 0x10);
        r->cas_unique =
             uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
             uVar19 << 0x38;
        r->flags = 0;
        if ((ulong)bVar1 != 0) {
          if (bVar1 != 4) goto LAB_00124d9c;
          uVar4 = *(uint *)(pcVar8 + 0x18);
          r->flags = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
          ;
        }
        if (uVar3 != 0 || 1 < bVar2 - YRMCDS_CMD_INCREMENT) {
          puVar14 = (ulong *)(pcVar13 + uVar5);
          if (uVar22 == uVar15) {
            puVar14 = (ulong *)0x0;
          }
          r->value = 0;
          r->data = (char *)puVar14;
          r->data_len = (ulong)(uVar22 - uVar15);
          c->last_size = uVar26;
          return YRMCDS_OK;
        }
        r->data = (char *)0x0;
        r->data_len = 0;
        if (uVar22 - uVar15 == 8) {
          uVar19 = *(ulong *)(pcVar13 + uVar5);
          r->value = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                     (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                     (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                     (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
          c->last_size = uVar26;
          return YRMCDS_OK;
        }
      }
    }
  }
LAB_00124d9c:
  c->invalid = 1;
  return YRMCDS_PROTOCOL_ERROR;
}

Assistant:

yrmcds_error yrmcds_recv(yrmcds* c, yrmcds_response* r) {
    if( c == NULL || r == NULL )
        return YRMCDS_BAD_ARGUMENT;
    if( c->invalid )
        return YRMCDS_PROTOCOL_ERROR;

    if( c->last_size > 0 ) {
        size_t remain = c->used - c->last_size;
        if( remain > 0 )
            memmove(c->recvbuf, c->recvbuf + c->last_size, remain);
        c->used = remain;
        c->last_size = 0;
        free(c->decompressed);
        c->decompressed = NULL;
    }

    if( c->text_mode ) {
        return text_recv(c, r);
    }

    while( c->used < BINARY_HEADER_SIZE ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    if( *c->recvbuf != '\x81' ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    uint32_t total_len = ntoh32(c->recvbuf + 8);
    if( total_len > MAX_CAPACITY ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    while( c->used < (BINARY_HEADER_SIZE + total_len) ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    uint16_t key_len = ntoh16(c->recvbuf + 2);
    uint8_t extras_len = *(unsigned char*)(c->recvbuf + 4);
    if( total_len < (key_len + extras_len) ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }

    const char* pkey = c->recvbuf + (BINARY_HEADER_SIZE + extras_len);
    r->length = BINARY_HEADER_SIZE + total_len;
    r->command = *(unsigned char*)(c->recvbuf + 1);
    r->key = key_len ? pkey : NULL;
    r->key_len = key_len;
    r->status = ntoh16(c->recvbuf + 6);
    memcpy(&(r->serial), c->recvbuf + 12, 4);
    r->cas_unique = ntoh64(c->recvbuf + 16);
    r->flags = 0;
    if( extras_len > 0 ) {
        if( extras_len != 4 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags = ntoh32(c->recvbuf + BINARY_HEADER_SIZE);
    }

    size_t data_len = total_len - key_len - extras_len;
    const char* pdata = pkey + key_len;

    if( (r->command == YRMCDS_CMD_INCREMENT ||
         r->command == YRMCDS_CMD_DECREMENT) &&
        (r->status == YRMCDS_STATUS_OK) ) {
        r->data = NULL;
        r->data_len = 0;
        if( data_len != 8 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->value = ntoh64(pdata);
        c->last_size = r->length;
        return YRMCDS_OK;
    }
    r->value = 0;
    r->data = data_len ? pdata : NULL;
    r->data_len = data_len;

#ifdef LIBYRMCDS_USE_LZ4
    if( c->compress_size && (r->flags & YRMCDS_FLAG_COMPRESS) ) {
        if( data_len == 0 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags &= ~(uint32_t)YRMCDS_FLAG_COMPRESS;
        uint32_t decompress_size = ntoh32(pdata);
        if( UINT32_MAX > INT_MAX ) {
            if( decompress_size > INT_MAX ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
        }
        c->decompressed = (char*)malloc(decompress_size);
        if( c->decompressed == NULL )
            return YRMCDS_OUT_OF_MEMORY;
        int d = LZ4_decompress_safe(pdata + sizeof(uint32_t),
                                    c->decompressed,
                                    (int)(data_len - sizeof(uint32_t)),
                                    (int)decompress_size);
        if( d != decompress_size ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->data = c->decompressed;
        r->data_len = decompress_size;
    }
#endif // LIBYRMCDS_USE_LZ4

    c->last_size = r->length;
    return YRMCDS_OK;
}